

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint64_t block_fs(aec_stream *strm,int k)

{
  internal_state *state;
  uint64_t fs;
  size_t i;
  int k_local;
  aec_stream *strm_local;
  
  fs = 0;
  for (i = 0; i < strm->block_size; i = i + 1) {
    fs = (strm->state->block[i] >> ((byte)k & 0x1f)) + fs;
  }
  return fs;
}

Assistant:

static inline uint64_t block_fs(struct aec_stream *strm, int k)
{
    /**
       Sum FS of all samples in block for given splitting position.
    */

    size_t i;
    uint64_t fs = 0;
    struct internal_state *state = strm->state;

    for (i = 0; i < strm->block_size; i++)
        fs += (uint64_t)(state->block[i] >> k);

    return fs;
}